

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void do_test_tlsblock(size_t len_encoded,size_t max_bytes)

{
  bool bVar1;
  uint8_t *puVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int cond;
  uint cond_00;
  uint8_t *puVar10;
  ulong uVar11;
  bool bVar12;
  ptls_buffer_t local_58;
  size_t local_38;
  
  local_58.base = "";
  local_58.capacity = 0;
  local_58.off = 0;
  local_58.is_allocated = '\0';
  local_58.align_bits = '\0';
  iVar4 = ptls_buffer__do_pushv(&local_58,"",len_encoded);
  sVar3 = local_58.off;
  local_38 = max_bytes;
  if (iVar4 == 0) {
    bVar12 = max_bytes != 0;
    if (bVar12) {
      uVar8 = 0;
      do {
        iVar4 = ptls_buffer_reserve_aligned(&local_58,1,'\0');
        if (iVar4 == 0) {
          local_58.base[local_58.off] = (uint8_t)uVar8;
          local_58.off = local_58.off + 1;
          iVar4 = 0;
        }
        if (iVar4 != 0) goto LAB_00129e48;
        uVar8 = uVar8 + 1;
        bVar12 = uVar8 < local_38;
      } while (uVar8 != local_38);
    }
    iVar4 = 0;
LAB_00129e48:
    if (!bVar12) {
      uVar8 = local_58.off - sVar3;
      if (uVar8 >> ((char)len_encoded * '\b' & 0x3fU) == 0) {
        bVar12 = true;
        if (len_encoded != 0) {
          lVar7 = len_encoded * 8;
          lVar9 = -len_encoded;
          do {
            lVar7 = lVar7 + -8;
            local_58.base[lVar9 + sVar3] = (uint8_t)(uVar8 >> ((byte)lVar7 & 0x3f));
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
        }
        goto LAB_00129e78;
      }
      iVar4 = 0x20c;
    }
    bVar12 = false;
  }
  else {
    bVar12 = false;
  }
LAB_00129e78:
  sVar3 = local_58.off;
  puVar2 = local_58.base;
  bVar1 = false;
  if (!bVar12) goto LAB_0012a07d;
  if (local_58.off < len_encoded) {
    bVar12 = false;
    iVar4 = 0x32;
    puVar10 = local_58.base;
  }
  else {
    sVar5 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ulong)local_58.base[sVar5] | uVar8 << 8;
      sVar5 = sVar5 + 1;
    } while (len_encoded != sVar5);
    puVar10 = local_58.base + len_encoded;
    if (local_58.off - len_encoded < uVar8) {
      bVar12 = false;
      iVar4 = 0x32;
    }
    else {
      _ok((uint)(uVar8 == local_38),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x874);
      cond = 1;
      if (local_38 != 0) {
        sVar5 = 0;
        cond = 1;
        do {
          if ((uint8_t)sVar5 != puVar10[sVar5]) {
            cond = 0;
          }
          sVar5 = sVar5 + 1;
        } while (local_38 != sVar5);
      }
      puVar10 = puVar10 + uVar8;
      _ok(cond,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c"
          ,0x87a);
      bVar12 = true;
    }
  }
  bVar1 = false;
  if ((!bVar12) || (iVar4 = 0x32, bVar1 = false, puVar10 != puVar2 + sVar3)) goto LAB_0012a07d;
  iVar4 = ptls_buffer__do_pushv(&local_58,"",len_encoded);
  sVar3 = local_58.off;
  if (iVar4 == 0) {
    uVar8 = local_38 + 1;
    bVar12 = false;
    uVar11 = 0;
    do {
      iVar4 = ptls_buffer_reserve_aligned(&local_58,1,'\0');
      if (iVar4 == 0) {
        local_58.base[local_58.off] = '\x01';
        local_58.off = local_58.off + 1;
        iVar4 = 0;
      }
      if (iVar4 != 0) goto LAB_0012a020;
      bVar12 = local_38 <= uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
    iVar4 = 0;
LAB_0012a020:
    if (!bVar12) goto LAB_0012a05a;
    uVar8 = local_58.off - sVar3;
    bVar1 = true;
    if (uVar8 >> ((char)len_encoded * '\b' & 0x3fU) == 0) {
      bVar12 = true;
      if (len_encoded != 0) {
        lVar7 = len_encoded * 8;
        lVar9 = -len_encoded;
        do {
          lVar7 = lVar7 + -8;
          local_58.base[lVar9 + sVar3] = (uint8_t)(uVar8 >> ((byte)lVar7 & 0x3f));
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0);
      }
    }
    else {
      iVar4 = 0x20c;
      bVar12 = false;
    }
  }
  else {
LAB_0012a05a:
    bVar12 = false;
    bVar1 = false;
  }
  if (bVar12) {
    _ok(0,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
        0x884);
  }
LAB_0012a07d:
  if (iVar4 != 0) {
    if (bVar1) {
      cond_00 = (uint)(iVar4 == 0x20c);
      uVar6 = 0x889;
    }
    else {
      cond_00 = 0;
      uVar6 = 0x88b;
    }
    _ok(cond_00,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",uVar6);
  }
  puVar2 = local_58.base;
  (*ptls_clear_memory)(local_58.base,local_58.off);
  if (local_58.is_allocated != '\0') {
    free(puVar2);
  }
  return;
}

Assistant:

static void do_test_tlsblock(size_t len_encoded, size_t max_bytes)
{
    ptls_buffer_t buf;
    const uint8_t *src, *end;
    int expect_overflow = 0, ret;

    /* block that fits in */
    ptls_buffer_init(&buf, "", 0);
    ptls_buffer_push_block(&buf, len_encoded, {
        for (size_t i = 0; i < max_bytes; ++i)
            ptls_buffer_push(&buf, (uint8_t)i);
    });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, len_encoded, {
        ok(end - src == max_bytes);
        int bytes_eq = 1;
        for (size_t i = 0; i < max_bytes; ++i) {
            if (src[i] != (uint8_t)i)
                bytes_eq = 0;
        }
        ok(bytes_eq);
        src = end;
    });

    /* block that does not fit in */
    ptls_buffer_push_block(&buf, len_encoded, {
        for (size_t i = 0; i < max_bytes + 1; i++)
            ptls_buffer_push(&buf, 1);
        expect_overflow = 1;
    });
    ok(!"fail");

Exit:
    if (ret != 0) {
        if (expect_overflow) {
            ok(ret == PTLS_ERROR_BLOCK_OVERFLOW);
        } else {
            ok(!"fail");
        }
    }
    ptls_buffer_dispose(&buf);
}